

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::ArrayWithPreallocation
          (ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *this,ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *other)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong local_20;
  size_t i;
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *other_local;
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_local;
  
  this->numActive = 0;
  this->numAllocated = 8;
  bVar1 = isHeapAllocated(other);
  if (bVar1) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = other->numAllocated;
    resetToInternalStorage(other);
    other->numActive = 0;
  }
  else {
    pbVar2 = getPreallocatedSpace(this);
    this->items = pbVar2;
    this->numActive = other->numActive;
    for (local_20 = 0; local_20 < this->numActive; local_20 = local_20 + 1) {
      std::__cxx11::string::string
                ((string *)(this->items + local_20),(string *)(other->items + local_20));
    }
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }